

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::DispatchBindImageTexturesTest::iterate(DispatchBindImageTexturesTest *this)

{
  GLuint GVar1;
  Context *context;
  glBindImageTexturesFunc p_Var2;
  GLchar *__s;
  undefined8 uVar3;
  size_t sVar4;
  GLint GVar5;
  Functions *gl_00;
  int iVar6;
  GLenum GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar9;
  reference pvVar10;
  char *__s_00;
  void *__s1;
  TestContext *pTVar11;
  GLuint *result;
  GLint i_2;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  undefined1 local_4f0 [8];
  Program program;
  GLchar *loading_code;
  GLchar *image_type;
  GLchar *coords;
  GLchar index [16];
  size_t sum_start_position;
  size_t load_start_position;
  GLint i_1;
  string cs_source;
  size_t sum_position;
  size_t load_position;
  Buffer ssb_buffer;
  bool is_array;
  GLuint j;
  GLuint data [216];
  GLuint local_80;
  GLenum target;
  GLint i;
  undefined1 local_70 [8];
  Buffer texture_buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_ids;
  vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> texture;
  GLint local_20;
  GLuint sum;
  GLint max_textures;
  bool test_result;
  Functions *gl;
  DispatchBindImageTexturesTest *this_local;
  
  gl = (Functions *)this;
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  _max_textures = (Functions *)CONCAT44(extraout_var,iVar6);
  sum._3_1_ = 1;
  local_20 = 0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  (*_max_textures->getIntegerv)(0x8f38,&local_20);
  GVar7 = (*_max_textures->getError)();
  glu::checkError(GVar7,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xf84);
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::vector
            ((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> *)
             &texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texture_buffer.m_target);
  MultiBind::Buffer::Buffer((Buffer *)local_70);
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::resize
            ((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> *)
             &texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)local_20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texture_buffer.m_target,
             (long)local_20);
  local_80 = 0;
  do {
    GVar5 = local_20;
    if (local_20 <= (int)local_80) {
      p_Var2 = _max_textures->bindImageTextures;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &texture_buffer.m_target,0);
      (*p_Var2)(0,GVar5,pvVar10);
      GVar7 = (*_max_textures->getError)();
      glu::checkError(GVar7,"BindImageTextures",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0xfbe);
      MultiBind::Buffer::Buffer((Buffer *)&load_position);
      MultiBind::Buffer::InitData
                ((Buffer *)&load_position,(this->super_TestCase).m_context,0x90d2,0x88ea,4,
                 (GLvoid *)0x0);
      MultiBind::Buffer::BindBase((Buffer *)&load_position,0);
      __s = iterate::cs;
      sum_position = 0;
      cs_source.field_2._8_8_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i_1,__s,(allocator<char> *)((long)&load_start_position + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&load_start_position + 7));
      for (load_start_position._0_4_ = 0; sVar4 = sum_position, uVar3 = cs_source.field_2._8_8_,
          (int)(uint)load_start_position < local_20;
          load_start_position._0_4_ = (uint)load_start_position + 1) {
        sprintf((char *)&coords,"%d",(ulong)(uint)load_start_position);
        if ((int)(uint)load_start_position < 0xb) {
          image_type = iterate::coordinates[(int)(uint)load_start_position];
          loading_code = iterate::images[(int)(uint)load_start_position];
          program.m_context = (Context *)iterate::loading[(int)(uint)load_start_position];
        }
        else {
          image_type = iterate::coordinates[2];
          loading_code = iterate::images[2];
          program.m_context = (Context *)iterate::loading[2];
        }
        replaceToken("IMAGE_LIST",&sum_position,"IMAGE\nIMAGE_LIST",(string *)&i_1);
        sum_position = sVar4;
        replaceToken("IMAGE",&sum_position,iterate::image,(string *)&i_1);
        sum_position = sVar4;
        replaceToken("XXX",&sum_position,(GLchar *)&coords,(string *)&i_1);
        replaceToken("IMAGE",&sum_position,loading_code,(string *)&i_1);
        replaceToken("XXX",&sum_position,(GLchar *)&coords,(string *)&i_1);
        replaceToken("SUM_LIST",(size_t *)(cs_source.field_2._M_local_buf + 8),"LOADING + SUM_LIST",
                     (string *)&i_1);
        cs_source.field_2._8_8_ = uVar3;
        replaceToken("LOADING",(size_t *)(cs_source.field_2._M_local_buf + 8),
                     (GLchar *)program.m_context,(string *)&i_1);
        cs_source.field_2._8_8_ = uVar3;
        replaceToken("XXX",(size_t *)(cs_source.field_2._M_local_buf + 8),(GLchar *)&coords,
                     (string *)&i_1);
        replaceToken("COORDS",(size_t *)(cs_source.field_2._M_local_buf + 8),image_type,
                     (string *)&i_1);
      }
      replaceToken(" + SUM_LIST",(size_t *)(cs_source.field_2._M_local_buf + 8),"",(string *)&i_1);
      replaceToken("IMAGE_LIST",&sum_position,"",(string *)&i_1);
      MultiBind::Program::Program((Program *)local_4f0,(this->super_TestCase).m_context);
      __s_00 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,__s_00,&local_511);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"",&local_539);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"",&local_561);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"",&local_589);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"",&local_5b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i_2,"",(allocator<char> *)((long)&result + 7));
      MultiBind::Program::Init
                ((Program *)local_4f0,&local_510,&local_538,&local_560,&local_588,&local_5b0,
                 (string *)&i_2);
      std::__cxx11::string::~string((string *)&i_2);
      std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      std::__cxx11::string::~string((string *)&local_5b0);
      std::allocator<char>::~allocator(&local_5b1);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator(&local_589);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator(&local_561);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      MultiBind::Program::Use((Program *)local_4f0);
      for (result._0_4_ = 0; (int)result < local_20; result._0_4_ = (int)result + 1) {
        (*_max_textures->uniform1i)((int)result,(int)result);
        GVar7 = (*_max_textures->getError)();
        glu::checkError(GVar7,"Uniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                        ,0x1007);
      }
      (*_max_textures->dispatchCompute)(1,1,1);
      GVar7 = (*_max_textures->getError)();
      glu::checkError(GVar7,"DispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x100b);
      (*_max_textures->memoryBarrier)(0xffffffff);
      GVar7 = (*_max_textures->getError)();
      glu::checkError(GVar7,"MemoryBarrier",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x100e);
      __s1 = (*_max_textures->mapBuffer)(0x90d2,35000);
      GVar7 = (*_max_textures->getError)();
      glu::checkError(GVar7,"MapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      ,0x1011);
      iVar6 = memcmp(__s1,(void *)((long)&texture.
                                          super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),4)
      ;
      if (iVar6 != 0) {
        sum._3_1_ = 0;
      }
      (*_max_textures->unmapBuffer)(0x90d2);
      (*_max_textures->getError)();
      if ((sum._3_1_ & 1) == 1) {
        pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        tcu::TestContext::setTestResult(pTVar11,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        tcu::TestContext::setTestResult(pTVar11,QP_TEST_RESULT_FAIL,"Fail");
      }
      MultiBind::Program::~Program((Program *)local_4f0);
      std::__cxx11::string::~string((string *)&i_1);
      MultiBind::Buffer::~Buffer((Buffer *)&load_position);
      MultiBind::Buffer::~Buffer((Buffer *)local_70);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texture_buffer.m_target);
      std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::~vector
                ((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> *)
                 &texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return STOP;
    }
    data[0xd7] = getTarget(local_80);
    for (ssb_buffer._20_4_ = 0; (uint)ssb_buffer._20_4_ < 0xd8;
        ssb_buffer._20_4_ = ssb_buffer._20_4_ + 1) {
      data[(ulong)(uint)ssb_buffer._20_4_ - 2] = local_80;
    }
    texture.
    super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         texture.
         super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + local_80;
    ssb_buffer.m_target._3_1_ = 0;
    if (data[0xd7] == 0x8c2a) {
      MultiBind::Buffer::InitData
                ((Buffer *)local_70,(this->super_TestCase).m_context,0x8c2a,0x88ea,0x360,
                 &stack0xfffffffffffffc18);
      pvVar9 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
               ::operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                             *)&texture_ids.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)(int)local_80);
      MultiBind::Texture::InitBuffer(pvVar9,(this->super_TestCase).m_context,0x8236,local_70._0_4_);
    }
    else {
      if (data[0xd7] != 0x9100) {
        if (data[0xd7] != 0x9102) {
          pvVar9 = std::
                   vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::
                   operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                               *)&texture_ids.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)(int)local_80);
          MultiBind::Texture::InitStorage
                    (pvVar9,(this->super_TestCase).m_context,data[0xd7],1,0x8236,6,6,6,false);
          gl_00 = _max_textures;
          pvVar9 = std::
                   vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::
                   operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                               *)&texture_ids.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)(int)local_80);
          MultiBind::Texture::Bind(gl_00,pvVar9->m_id,data[0xd7]);
          MultiBind::Texture::SubImage
                    (_max_textures,data[0xd7],0,0,0,0,6,6,6,0x8d94,0x1405,&stack0xfffffffffffffc18);
          goto LAB_00ede5d3;
        }
        ssb_buffer.m_target._3_1_ = 1;
      }
      pvVar9 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
               ::operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                             *)&texture_ids.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)(int)local_80);
      MultiBind::Texture::InitStorage
                (pvVar9,(this->super_TestCase).m_context,data[0xd7],1,0x8236,6,6,6,false);
      context = (this->super_TestCase).m_context;
      pvVar9 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
               ::operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                             *)&texture_ids.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)(int)local_80);
      fillMSTexture(context,pvVar9->m_id,local_80,(bool)(ssb_buffer.m_target._3_1_ & 1));
    }
LAB_00ede5d3:
    MultiBind::Texture::Bind(_max_textures,0,data[0xd7]);
    pvVar9 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::
             operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                         *)&texture_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)(int)local_80);
    GVar1 = pvVar9->m_id;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &texture_buffer.m_target,(long)(int)local_80);
    *pvVar10 = GVar1;
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DispatchBindImageTexturesTest::iterate()
{
	static const GLchar* cs = "#version 440 core\n"
							  "\n"
							  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "IMAGE_LIST\n"
							  "layout (std140, binding = 0) buffer SSB {\n"
							  "    uint sum;\n"
							  "} ssb;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    uvec4 sum = SUM_LIST;\n"
							  "    ssb.sum = sum.r\n;"
							  "}\n"
							  "\n";

	static const GLchar* image = "layout (location = XXX, r32ui) readonly uniform IMAGE iXXX;";

	static const GLchar* loading[] = {
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS)",	"imageLoad(iXXX, COORDS)",   "imageLoad(iXXX, COORDS)",
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS)",	"imageLoad(iXXX, COORDS)",   "imageLoad(iXXX, COORDS)",
		"imageLoad(iXXX, COORDS)", "imageLoad(iXXX, COORDS, 0)", "imageLoad(iXXX, COORDS, 0)"
	};

	static const GLchar* images[] = { "uimage1D",	 "uimage1DArray", "uimage2D",		 "uimage2DArray",
									  "uimage3D",	 "uimageBuffer",  "uimageCube",	 "uimageCubeArray",
									  "uimage2DRect", "uimage2DMS",	"uimage2DMSArray" };

	static const GLchar* coordinates[] = {
		"0",
		"ivec2(0, 0)",
		"ivec2(0, 0)",
		"ivec3(0, 0, 0)",
		"ivec3(0, 0, 0)",
		"0",
		"ivec3(0, 0, 0)",
		"ivec3(0, 0, 0)",
		"ivec2(0, 0)",
		"ivec2(0, 0)",
		"ivec3(0, 0, 0)",
	};

	static const GLuint depth  = 6;
	static const GLuint height = 6;
	static const GLuint width  = 6;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLint  max_textures = 0;
	GLuint sum			= 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Textures */
	/* Storage */
	std::vector<Texture> texture;
	std::vector<GLuint>  texture_ids;
	Buffer				 texture_buffer;

	texture.resize(max_textures);
	texture_ids.resize(max_textures);

	/* Prepare */
	for (GLint i = 0; i < max_textures; ++i)
	{
		const GLenum target = getTarget(i);

		GLuint data[width * height * depth];

		for (GLuint j = 0; j < width * height * depth; ++j)
		{
			data[j] = i;
		}

		sum += i;

		bool is_array = false;

		switch (target)
		{
		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
			is_array = true;
		/* Intended pass-through */

		case GL_TEXTURE_2D_MULTISAMPLE:
			texture[i].InitStorage(m_context, target, 1, GL_R32UI, width, height, depth);
			fillMSTexture(m_context, texture[i].m_id, i, is_array);
			break;

		case GL_TEXTURE_BUFFER:
			texture_buffer.InitData(m_context, GL_TEXTURE_BUFFER, GL_DYNAMIC_COPY, sizeof(data), data);
			texture[i].InitBuffer(m_context, GL_R32UI, texture_buffer.m_id);
			break;

		default:
			texture[i].InitStorage(m_context, target, 1, GL_R32UI, width, height, depth);
			Texture::Bind(gl, texture[i].m_id, target);
			Texture::SubImage(gl, target, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, width, height, depth,
							  GL_RED_INTEGER, GL_UNSIGNED_INT, &data);
			break;
		}

		/* Clean */
		Texture::Bind(gl, 0, target);

		texture_ids[i] = texture[i].m_id;
	}

	gl.bindImageTextures(0 /* first */, max_textures /* count */, &texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTextures");

	/* SSBO */
	Buffer ssb_buffer;
	ssb_buffer.InitData(m_context, GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(GLuint), 0 /* data */);

	ssb_buffer.BindBase(0);

	/* Prepare program */
	size_t		load_position = 0;
	size_t		sum_position  = 0;
	std::string cs_source	 = cs;
	for (GLint i = 0; i < max_textures; ++i)
	{
		size_t load_start_position = load_position;
		size_t sum_start_position  = sum_position;

		GLchar index[16];

		sprintf(index, "%d", i);

		const GLchar* coords	   = 0;
		const GLchar* image_type   = 0;
		const GLchar* loading_code = 0;

		if (i < (GLint)s_n_texture_tragets)
		{
			coords		 = coordinates[i];
			image_type   = images[i];
			loading_code = loading[i];
		}
		else
		{
			coords		 = coordinates[2]; /* vec2(0.5f, 0.5f) */
			image_type   = images[2];	  /* usampler2D */
			loading_code = loading[2];	 /* texture(sXXX, COORDS) */
		}

		/* Add entry to ubo list */
		replaceToken("IMAGE_LIST", load_position, "IMAGE\nIMAGE_LIST", cs_source);
		load_position = load_start_position;

		replaceToken("IMAGE", load_position, image, cs_source);
		load_position = load_start_position;

		replaceToken("XXX", load_position, index, cs_source);
		replaceToken("IMAGE", load_position, image_type, cs_source);
		replaceToken("XXX", load_position, index, cs_source);

		/* Add entry to sum list */
		replaceToken("SUM_LIST", sum_position, "LOADING + SUM_LIST", cs_source);
		sum_position = sum_start_position;

		replaceToken("LOADING", sum_position, loading_code, cs_source);
		sum_position = sum_start_position;

		replaceToken("XXX", sum_position, index, cs_source);
		replaceToken("COORDS", sum_position, coords, cs_source);
	}

	/* Remove token for lists */
	replaceToken(" + SUM_LIST", sum_position, "", cs_source);
	replaceToken("IMAGE_LIST", load_position, "", cs_source);

	Program program(m_context);
	program.Init(cs_source.c_str(), "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);

	program.Use();

	/* Set images */
	for (GLint i = 0; i < max_textures; ++i)
	{
		gl.uniform1i(i, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");
	}

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	gl.memoryBarrier(GL_ALL_BARRIER_BITS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	GLuint* result = (GLuint*)gl.mapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	if (0 != memcmp(result, &sum, sizeof(sum)))
	{
		test_result = false;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	gl.getError(); /* Ignore error */

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}